

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O3

Vec_Int_t * Gia_AigerCollectLiterals(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  
  iVar3 = p->nRegs;
  pVVar9 = p->vCos;
  uVar5 = (ulong)(uint)pVVar9->nSize;
  iVar8 = pVVar9->nSize - iVar3;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar6 = iVar8;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar4;
  if (0 < iVar3) {
    iVar6 = 0;
    do {
      pVVar9 = p->vCos;
      uVar1 = pVVar9->nSize;
      uVar5 = (ulong)uVar1;
      uVar2 = (uVar1 - iVar3) + iVar6;
      if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_001ce46b;
      iVar8 = pVVar9->pArray[uVar2];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_001ce44c;
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_001ce3cd;
      uVar1 = *(uint *)(p->pObjs + iVar8);
      iVar8 = iVar8 - (uVar1 & 0x1fffffff);
      if (iVar8 < 0) goto LAB_001ce48a;
      Vec_IntPush(p_00,(uVar1 >> 0x1d & 1) + iVar8 * 2);
      iVar6 = iVar6 + 1;
      iVar3 = p->nRegs;
    } while (iVar6 < iVar3);
    pVVar9 = p->vCos;
    uVar5 = (ulong)(uint)pVVar9->nSize;
  }
LAB_001ce3cd:
  if (iVar3 < (int)uVar5) {
    lVar7 = 0;
    do {
      if ((int)uVar5 <= lVar7) {
LAB_001ce46b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar9->pArray[lVar7];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_001ce44c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      uVar1 = *(uint *)(p->pObjs + iVar3);
      iVar3 = iVar3 - (uVar1 & 0x1fffffff);
      if (iVar3 < 0) {
LAB_001ce48a:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_00,(uVar1 >> 0x1d & 1) + iVar3 * 2);
      lVar7 = lVar7 + 1;
      pVVar9 = p->vCos;
      uVar5 = (ulong)pVVar9->nSize;
    } while (lVar7 < (long)(uVar5 - (long)p->nRegs));
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_AigerCollectLiterals( Gia_Man_t * p )
{
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int i;
    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    return vLits;
}